

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::Internal::log_thread_callback(LogLevel level,char *fmt,...)

{
  long lVar1;
  long lVar2;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  char buffer [8192];
  undefined8 local_2108;
  void **local_2100;
  undefined1 *local_20f8;
  undefined1 local_20e8 [16];
  undefined8 local_20d8;
  undefined8 local_20d0;
  undefined8 local_20c8;
  undefined8 local_20c0;
  undefined8 local_20b8;
  undefined8 local_20a8;
  undefined8 local_2098;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 local_2048;
  char local_2038 [8191];
  undefined1 local_39;
  
  if (in_AL != '\0') {
    local_20b8 = in_XMM0_Qa;
    local_20a8 = in_XMM1_Qa;
    local_2098 = in_XMM2_Qa;
    local_2088 = in_XMM3_Qa;
    local_2078 = in_XMM4_Qa;
    local_2068 = in_XMM5_Qa;
    local_2058 = in_XMM6_Qa;
    local_2048 = in_XMM7_Qa;
  }
  lVar1 = *in_FS_OFFSET;
  lVar2 = *(long *)(lVar1 + -0x10);
  if (lVar2 != 0) {
    local_20f8 = local_20e8;
    local_2100 = &va[0].overflow_arg_area;
    local_2108 = 0x3000000010;
    local_20d8 = in_RDX;
    local_20d0 = in_RCX;
    local_20c8 = in_R8;
    local_20c0 = in_R9;
    vsnprintf(local_2038,0x2000,fmt,&local_2108);
    local_39 = 0;
    (**(code **)(lVar1 + -0x10))(level,local_2038,*(undefined8 *)(lVar1 + -8));
  }
  return lVar2 != 0;
}

Assistant:

bool log_thread_callback(LogLevel level, const char *fmt, ...)
{
	if (!thread_log_callback)
		return false;

	va_list va;
	va_start(va, fmt);
	char buffer[8 * 1024];
	vsnprintf(buffer, sizeof(buffer), fmt, va);
	// Guard against ancient MSVC bugs.
	buffer[sizeof(buffer) - 1] = '\0';
	va_end(va);
	thread_log_callback(level, buffer, thread_log_userdata);
	return true;
}